

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassConfidenceThresholding.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::ClassConfidenceThresholding::_InternalParse
          (ClassConfidenceThresholding *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  int iVar1;
  ulong uVar2;
  Rep *pRVar3;
  bool bVar4;
  PrecisionRecallCurve *obj;
  MessageLite *msg;
  uint res;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *pbVar5;
  pair<const_char_*,_unsigned_int> pVar6;
  byte *local_38;
  
  local_38 = (byte *)ptr;
  bVar4 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
  if (!bVar4) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    do {
      res = (uint)*local_38;
      pbVar5 = local_38 + 1;
      if ((char)*local_38 < '\0') {
        res = (res + (uint)*pbVar5 * 0x80) - 0x80;
        if ((char)*pbVar5 < '\0') {
          pVar6 = google::protobuf::internal::ReadTagFallback((char *)local_38,res);
          pbVar5 = (byte *)pVar6.first;
          res = pVar6.second;
        }
        else {
          pbVar5 = local_38 + 2;
        }
        if (res != 0x322) goto LAB_0031e75a;
        local_38 = pbVar5 + -2;
        do {
          local_38 = local_38 + 2;
          pRVar3 = (this->precisionrecallcurves_).super_RepeatedPtrFieldBase.rep_;
          if (pRVar3 == (Rep *)0x0) {
LAB_0031e7fe:
            obj = google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::PrecisionRecallCurve>
                            ((this->precisionrecallcurves_).super_RepeatedPtrFieldBase.arena_);
            msg = (MessageLite *)
                  google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                            (&(this->precisionrecallcurves_).super_RepeatedPtrFieldBase,obj);
          }
          else {
            iVar1 = (this->precisionrecallcurves_).super_RepeatedPtrFieldBase.current_size_;
            if (pRVar3->allocated_size <= iVar1) goto LAB_0031e7fe;
            (this->precisionrecallcurves_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
            msg = (MessageLite *)pRVar3->elements[iVar1];
          }
          local_38 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                       (ctx,msg,(char *)local_38);
          if (local_38 == (byte *)0x0) {
            return (char *)0x0;
          }
        } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) &&
                (*(short *)local_38 == 0x6a2));
      }
      else {
LAB_0031e75a:
        if ((res == 0) || ((res & 7) == 4)) {
          if (pbVar5 == (byte *)0x0) {
            return (char *)0x0;
          }
          (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
          return (char *)pbVar5;
        }
        uVar2 = this_00->ptr_;
        local_38 = pbVar5;
        if ((uVar2 & 1) == 0) {
          unknown = google::protobuf::internal::InternalMetadata::
                    mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
        }
        else {
          unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((uVar2 & 0xfffffffffffffffc) + 8);
        }
        local_38 = (byte *)google::protobuf::internal::UnknownFieldParse
                                     (res,unknown,(char *)local_38,ctx);
        if (local_38 == (byte *)0x0) {
          return (char *)0x0;
        }
      }
      bVar4 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    } while (!bVar4);
  }
  return (char *)local_38;
}

Assistant:

const char* ClassConfidenceThresholding::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // repeated .CoreML.Specification.PrecisionRecallCurve precisionRecallCurves = 100;
      case 100:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_precisionrecallcurves(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<802>(ptr));
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}